

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  uint uVar2;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar3;
  JOCTET *pJVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  uVar2 = cinfo->Al;
  pjVar3 = cinfo->dest;
  entropy->next_output_byte = pjVar3->next_output_byte;
  entropy->free_in_buffer = pjVar3->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar7 = cinfo->blocks_in_MCU;
  if (0 < iVar7) {
    lVar6 = 0;
    do {
      if (entropy->gather_statistics == 0) {
        iVar8 = (entropy->saved).put_bits;
        uVar9 = (ulong)(((uint)(int)(*MCU_data[lVar6])[0] >> (uVar2 & 0x1f) & 1) != 0) <<
                (0x17U - (char)iVar8 & 0x3f) | (entropy->saved).put_buffer;
        if (iVar8 < 7) {
          iVar8 = iVar8 + 1;
        }
        else {
          iVar7 = iVar8 + 9;
          do {
            iVar8 = iVar7;
            pJVar4 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar4 + 1;
            *pJVar4 = (JOCTET)(uVar9 >> 0x10);
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
            if ((~(uint)uVar9 & 0xff0000) == 0) {
              pJVar4 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar4 + 1;
              *pJVar4 = '\0';
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
            }
            uVar9 = uVar9 << 8;
            iVar7 = iVar8 + -8;
          } while (0xf < iVar7);
          iVar7 = cinfo->blocks_in_MCU;
          iVar8 = iVar8 + -0x10;
        }
        (entropy->saved).put_buffer = uVar9;
        (entropy->saved).put_bits = iVar8;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar7);
  }
  pjVar3 = cinfo->dest;
  pjVar3->next_output_byte = entropy->next_output_byte;
  pjVar3->free_in_buffer = entropy->free_in_buffer;
  uVar2 = cinfo->restart_interval;
  if (uVar2 != 0) {
    uVar5 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar5 = uVar2;
    }
    entropy->restarts_to_go = uVar5 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int Al, blkn;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  Al = cinfo->Al;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* We simply emit the Al'th bit of the DC coefficient value. */
    arith_encode(cinfo, st, (MCU_data[blkn][0][0] >> Al) & 1);
  }

  return TRUE;
}